

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_PermuteExtensions_Test::TestBody(SSLTest_PermuteExtensions_Test *this)

{
  pointer *this_00;
  bool bVar1;
  char *pcVar2;
  const_iterator pbVar3;
  SSL_METHOD *pSVar4;
  pointer psVar5;
  Message *message;
  char *in_R9;
  pointer local_368;
  string local_358;
  AssertHelper local_338;
  Message local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__6;
  int i;
  bool passed;
  Message local_2c0;
  uint local_2b4;
  size_type local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_278;
  Message local_270;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_230;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__4;
  Message local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1d0;
  Message local_1c8;
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> order2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> order1;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<SSL_CTX> ctx;
  ScopedTrace gtest_trace_9205;
  bool decrypt_ech;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<bool> local_c8;
  initializer_list<bool> *local_b8;
  initializer_list<bool> *__range3;
  SSL_ECH_KEYS *maybe_keys;
  ScopedTrace gtest_trace_9202;
  const_iterator pbStack_a0;
  bool offer_ech;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_88;
  initializer_list<bool> *local_78;
  initializer_list<bool> *__range2;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_ECH_KEYS> keys;
  SSLTest_PermuteExtensions_Test *this_local;
  
  MakeTestECHKeys((anon_unknown_0 *)&gtest_ar_.message_,'\x01');
  testing::AssertionResult::
  AssertionResult<std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4dabc5,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x23f0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  __range2._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (__range2._4_4_ == 0) {
    __begin2._6_1_ = 0;
    __begin2._7_1_ = 1;
    local_88._M_array = (iterator)((long)&__begin2 + 6);
    local_88._M_len = 2;
    local_78 = &local_88;
    __end2 = std::initializer_list<bool>::begin(local_78);
    pbStack_a0 = std::initializer_list<bool>::end(local_78);
    for (; __end2 != pbStack_a0; __end2 = __end2 + 1) {
      maybe_keys._7_1_ = *__end2 & 1;
      testing::ScopedTrace::ScopedTrace<bool>
                ((ScopedTrace *)((long)&maybe_keys + 6),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x23f2,(bool *)((long)&maybe_keys + 7));
      if ((maybe_keys._7_1_ & 1) == 0) {
        local_368 = (pointer)0x0;
      }
      else {
        local_368 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                               &gtest_ar_.message_);
      }
      __range3 = (initializer_list<bool> *)local_368;
      __begin3._6_1_ = 0;
      __begin3._7_1_ = 1;
      local_c8._M_array = (iterator)((long)&__begin3 + 6);
      local_c8._M_len = 2;
      local_b8 = &local_c8;
      __end3 = std::initializer_list<bool>::begin(local_b8);
      pbVar3 = std::initializer_list<bool>::end(local_b8);
      for (; __end3 != pbVar3; __end3 = __end3 + 1) {
        ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl._7_1_ = *__end3 & 1;
        testing::ScopedTrace::ScopedTrace<bool>
                  ((ScopedTrace *)
                   ((long)&ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 6),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x23f5,(bool *)((long)&ctx._M_t.
                                           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl
                                   + 7));
        if (((maybe_keys._7_1_ & 1) == 0) &&
           ((ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl._7_1_ & 1) != 0)) {
          __range2._4_4_ = 5;
        }
        else {
          pSVar4 = (SSL_METHOD *)TLS_method();
          psVar5 = (pointer)SSL_CTX_new(pSVar4);
          std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,psVar5)
          ;
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_100,
                     (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
          if (!bVar1) {
            testing::Message::Message(&local_108);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)
                       &order1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_100,
                       (AssertionResult *)0x4d86cd,"false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x23fc,pcVar2);
            testing::internal::AssertHelper::operator=(&local_110,&local_108);
            testing::internal::AssertHelper::~AssertHelper(&local_110);
            std::__cxx11::string::~string
                      ((string *)
                       &order1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            testing::Message::~Message(&local_108);
          }
          __range2._4_4_ = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
          if (__range2._4_4_ == 0) {
            this_00 = &order2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00);
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       &gtest_ar__2.message_);
            psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            local_171 = GetExtensionOrder(psVar5,(vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)this_00,(SSL_ECH_KEYS *)__range3,
                                          (bool)(ctx._M_t.
                                                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_ssl_ctx_st_*,_false>.
                                                 _M_head_impl._7_1_ & 1));
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_170,&local_171,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
            if (!bVar1) {
              testing::Message::Message(&local_180);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__3.message_,(internal *)local_170,
                         (AssertionResult *)
                         "GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech)","false",
                         "true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_188,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x23ff,pcVar2);
              testing::internal::AssertHelper::operator=(&local_188,&local_180);
              testing::internal::AssertHelper::~AssertHelper(&local_188);
              std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
              testing::Message::~Message(&local_180);
            }
            __range2._4_4_ = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
            if (__range2._4_4_ == 0) {
              psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
              local_1b9 = GetExtensionOrder(psVar5,(
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)&gtest_ar__2.message_,(SSL_ECH_KEYS *)__range3,
                                            (bool)(ctx._M_t.
                                                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_ctx_st_*,_false>.
                                                  _M_head_impl._7_1_ & 1));
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
              if (!bVar1) {
                testing::Message::Message(&local_1c8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar.message_,(internal *)local_1b8,
                           (AssertionResult *)
                           "GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech)","false",
                           "true",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_1d0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x2401,pcVar2);
                testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
                testing::internal::AssertHelper::~AssertHelper(&local_1d0);
                std::__cxx11::string::~string((string *)&gtest_ar.message_);
                testing::Message::~Message(&local_1c8);
              }
              __range2._4_4_ = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
              if (__range2._4_4_ == 0) {
                testing::internal::EqHelper::
                Compare<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_nullptr>
                          ((EqHelper *)local_200,"order1","order2",
                           (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           &order2.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           &gtest_ar__2.message_);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_200);
                if (!bVar1) {
                  testing::Message::Message(&local_208);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2402,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4.message_,&local_208);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__4.message_);
                  testing::Message::~Message(&local_208);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
                pSVar4 = (SSL_METHOD *)TLS_method();
                psVar5 = (pointer)SSL_CTX_new(pSVar4);
                std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::reset
                          ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                           psVar5);
                testing::AssertionResult::
                AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                          ((AssertionResult *)local_220,
                           (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                           (type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_220);
                if (!bVar1) {
                  testing::Message::Message(&local_228);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__5.message_,(internal *)local_220,
                             (AssertionResult *)0x4d86cd,"false","true",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_230,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2405,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_230,&local_228);
                  testing::internal::AssertHelper::~AssertHelper(&local_230);
                  std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
                  testing::Message::~Message(&local_228);
                }
                __range2._4_4_ = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
                if (__range2._4_4_ == 0) {
                  psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__1.message_);
                  SSL_CTX_set_permute_extensions(psVar5,1);
                  psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__1.message_);
                  local_261 = GetExtensionOrder(psVar5,(
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)&order2.
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                ,(SSL_ECH_KEYS *)__range3,
                                                (bool)(ctx._M_t.
                                                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_ctx_st_*,_false>.
                                                  _M_head_impl._7_1_ & 1));
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_260,&local_261,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_260);
                  if (!bVar1) {
                    testing::Message::Message(&local_270);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar_1.message_,(internal *)local_260,
                               (AssertionResult *)
                               "GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech)",
                               "false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_278,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x2412,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_278,&local_270);
                    testing::internal::AssertHelper::~AssertHelper(&local_278);
                    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
                    testing::Message::~Message(&local_270);
                  }
                  __range2._4_4_ = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
                  if (__range2._4_4_ == 0) {
                    local_2b0 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                                          ((vector<unsigned_short,_std::allocator<unsigned_short>_>
                                            *)&order2.
                                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    local_2b4 = 5;
                    testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
                              ((internal *)local_2a8,"order1.size()","5u",&local_2b0,&local_2b4);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2a8);
                    if (!bVar1) {
                      testing::Message::Message(&local_2c0);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_2a8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&i,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x2413,pcVar2);
                      testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_2c0);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
                      testing::Message::~Message(&local_2c0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
                    gtest_ar__6.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._7_1_ = 0;
                    for (gtest_ar__6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_ = 0;
                        (int)gtest_ar__6.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl < 0xe;
                        gtest_ar__6.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._0_4_ =
                             (int)gtest_ar__6.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 1) {
                      psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__1.message_);
                      local_2e1 = GetExtensionOrder(psVar5,(
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)&gtest_ar__2.message_,(SSL_ECH_KEYS *)__range3,
                                                  (bool)(ctx._M_t.
                                                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_ctx_st_*,_false>.
                                                  _M_head_impl._7_1_ & 1));
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_2e0);
                      if (!bVar1) {
                        testing::Message::Message(&local_2f0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__7.message_,(internal *)local_2e0,
                                   (AssertionResult *)
                                   "GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech)",
                                   "false","true",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_2f8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x2418,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
                        testing::internal::AssertHelper::~AssertHelper(&local_2f8);
                        std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                        testing::Message::~Message(&local_2f0);
                      }
                      __range2._4_4_ = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
                      if (__range2._4_4_ != 0) goto LAB_002541d1;
                      bVar1 = std::operator!=((vector<unsigned_short,_std::allocator<unsigned_short>_>
                                               *)&order2.
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              ,(vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                *)&gtest_ar__2.message_);
                      if (bVar1) {
                        gtest_ar__6.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._7_1_ = 1;
                        break;
                      }
                    }
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_328,
                               (bool *)((long)&gtest_ar__6.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       + 7),(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_328);
                    if (!bVar1) {
                      testing::Message::Message(&local_330);
                      message = testing::Message::operator<<
                                          (&local_330,(char (*) [29])"Extensions were not permuted")
                      ;
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_358,(internal *)local_328,(AssertionResult *)"passed",
                                 "false","true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_338,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x241e,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_338,message);
                      testing::internal::AssertHelper::~AssertHelper(&local_338);
                      std::__cxx11::string::~string((string *)&local_358);
                      testing::Message::~Message(&local_330);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
                    __range2._4_4_ = 0;
                  }
                }
              }
            }
LAB_002541d1:
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       &gtest_ar__2.message_);
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       &order2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
        }
        testing::ScopedTrace::~ScopedTrace
                  ((ScopedTrace *)
                   ((long)&ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 6));
        if ((__range2._4_4_ != 0) && (__range2._4_4_ != 5)) goto LAB_0025427b;
      }
      __range2._4_4_ = 0;
LAB_0025427b:
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&maybe_keys + 6));
      if (__range2._4_4_ != 0) goto LAB_002542be;
    }
    __range2._4_4_ = 0;
  }
LAB_002542be:
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, PermuteExtensions) {
  bssl::UniquePtr<SSL_ECH_KEYS> keys = MakeTestECHKeys();
  ASSERT_TRUE(keys);
  for (bool offer_ech : {false, true}) {
    SCOPED_TRACE(offer_ech);
    SSL_ECH_KEYS *maybe_keys = offer_ech ? keys.get() : nullptr;
    for (bool decrypt_ech : {false, true}) {
      SCOPED_TRACE(decrypt_ech);
      if (!offer_ech && decrypt_ech) {
        continue;
      }

      // When extension permutation is disabled, the order should be consistent.
      bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
      ASSERT_TRUE(ctx);
      std::vector<uint16_t> order1, order2;
      ASSERT_TRUE(
          GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech));
      ASSERT_TRUE(
          GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech));
      EXPECT_EQ(order1, order2);

      ctx.reset(SSL_CTX_new(TLS_method()));
      ASSERT_TRUE(ctx);
      SSL_CTX_set_permute_extensions(ctx.get(), 1);

      // When extension permutation is enabled, each ClientHello should have a
      // different order.
      //
      // This test is inherently flaky, so we run it multiple times. We send at
      // least five extensions by default from TLS 1.3: supported_versions,
      // key_share, supported_groups, psk_key_exchange_modes, and
      // signature_algorithms. That means the probability of a false negative is
      // at most 1/120. Repeating the test 14 times lowers false negative rate
      // to under 2^-96.
      ASSERT_TRUE(
          GetExtensionOrder(ctx.get(), &order1, maybe_keys, decrypt_ech));
      EXPECT_GE(order1.size(), 5u);
      static const int kNumIterations = 14;
      bool passed = false;
      for (int i = 0; i < kNumIterations; i++) {
        ASSERT_TRUE(
            GetExtensionOrder(ctx.get(), &order2, maybe_keys, decrypt_ech));
        if (order1 != order2) {
          passed = true;
          break;
        }
      }
      EXPECT_TRUE(passed) << "Extensions were not permuted";
    }
  }
}